

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O1

int __thiscall DNANode::remove(DNANode *this,char *__filename)

{
  long lVar1;
  long in_RDX;
  
  for (lVar1 = 0; in_RDX != lVar1; lVar1 = lVar1 + 1) {
    this = this->childNodes[*(uint *)(__filename + lVar1 * 4)];
    if (this == (DNANode *)0x0) goto LAB_0010135a;
  }
  this->count = -1;
LAB_0010135a:
  return (int)lVar1;
}

Assistant:

void DNANode::remove(const DNA::Base* dna, size_t size)
{
    if (!size) {
        count = -1;
        return;
    }
    DNANode* nextNode = childNodes[*dna];
    if (nextNode != nullptr)
        nextNode->remove(dna + 1, size - 1);
}